

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenerateNestedVerifierTypes_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,Type *type)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined4 local_50;
  undefined1 local_40 [8];
  string string_type;
  Type *type_local;
  SwiftGenerator *this_local;
  
  string_type.field_2._8_8_ = type;
  GenType_abi_cxx11_((string *)local_40,this,type,false);
  bVar1 = IsScalar(*(BaseType *)string_type.field_2._8_8_);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  else {
    bVar1 = IsString((Type *)string_type.field_2._8_8_);
    if (bVar1) {
      std::operator+(&local_70,"ForwardOffset<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(__return_storage_ptr__,&local_70,">");
      std::__cxx11::string::~string((string *)&local_70);
    }
    else if ((*(long *)(string_type.field_2._8_8_ + 8) == 0) ||
            ((*(byte *)(*(long *)(string_type.field_2._8_8_ + 8) + 0x110) & 1) == 0)) {
      std::operator+(&local_90,"ForwardOffset<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(__return_storage_ptr__,&local_90,">");
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
    }
  }
  local_50 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateNestedVerifierTypes(const Type &type) {
    const auto string_type = GenType(type);

    if (IsScalar(type.base_type)) { return string_type; }

    if (IsString(type)) { return "ForwardOffset<" + string_type + ">"; }

    if (type.struct_def && type.struct_def->fixed) { return string_type; }

    return "ForwardOffset<" + string_type + ">";
  }